

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_named_interface_blocks.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_64de3::flatten_named_interface_blocks_declarations::handle_rvalue
          (flatten_named_interface_blocks_declarations *this,ir_rvalue **rvalue)

{
  ir_rvalue *piVar1;
  long lVar2;
  ir_variable *var;
  ir_dereference_array *deref_array_prev;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar5;
  hash_entry *phVar6;
  ir_dereference_variable *this_00;
  glsl_type *t;
  long lVar7;
  long lVar4;
  
  piVar1 = *rvalue;
  if ((piVar1 != (ir_rvalue *)0x0) &&
     ((piVar1->super_ir_instruction).ir_type == ir_type_dereference_record)) {
    iVar3 = (*(piVar1->super_ir_instruction)._vptr_ir_instruction[8])(piVar1);
    lVar4 = CONCAT44(extraout_var,iVar3);
    if (lVar4 != 0) {
      for (lVar7 = *(long *)(lVar4 + 0x20); *(char *)(lVar7 + 4) == '\x11';
          lVar7 = *(long *)(lVar7 + 0x20)) {
      }
      lVar2 = *(long *)(lVar4 + 0x88);
      if (((lVar7 == lVar2) && (lVar2 != 0)) && (1 < (*(uint *)(lVar4 + 0x40) >> 0xc & 0xf) - 1)) {
        pcVar5 = " out";
        if ((*(uint *)(lVar4 + 0x40) & 0xf000) == 0x4000) {
          pcVar5 = " in";
        }
        pcVar5 = ralloc_asprintf(this->mem_ctx,"%s %s.%s.%s",pcVar5 + 1,
                                 *(undefined8 *)(lVar2 + 0x10),*(undefined8 *)(lVar4 + 0x28),
                                 *(undefined8 *)
                                  (*(long *)(piVar1[1].super_ir_instruction._vptr_ir_instruction[4]
                                            + 0x20) + 8 +
                                  (long)*(int *)&piVar1[1].super_ir_instruction.super_exec_node.next
                                  * 0x30));
        phVar6 = _mesa_hash_table_search(this->interface_namespace,pcVar5);
        if (phVar6 == (hash_entry *)0x0) {
          __assert_fail("entry",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_named_interface_blocks.cpp"
                        ,0x127,
                        "virtual void (anonymous namespace)::flatten_named_interface_blocks_declarations::handle_rvalue(ir_rvalue **)"
                       );
        }
        var = (ir_variable *)phVar6->data;
        this_00 = (ir_dereference_variable *)exec_node::operator_new(0x30,this->mem_ctx);
        ir_dereference_variable::ir_dereference_variable(this_00,var);
        deref_array_prev =
             (ir_dereference_array *)piVar1[1].super_ir_instruction._vptr_ir_instruction;
        if ((deref_array_prev != (ir_dereference_array *)0x0) &&
           ((deref_array_prev->super_ir_dereference).super_ir_rvalue.super_ir_instruction.ir_type ==
            ir_type_dereference_array)) {
          this_00 = (ir_dereference_variable *)
                    process_array_ir(this->mem_ctx,deref_array_prev,(ir_rvalue *)this_00);
        }
        *rvalue = (ir_rvalue *)this_00;
      }
    }
  }
  return;
}

Assistant:

void
flatten_named_interface_blocks_declarations::handle_rvalue(ir_rvalue **rvalue)
{
   if (*rvalue == NULL)
      return;

   ir_dereference_record *ir = (*rvalue)->as_dereference_record();
   if (ir == NULL)
      return;

   ir_variable *var = ir->variable_referenced();
   if (var == NULL)
      return;

   if (!var->is_interface_instance())
      return;

   /* It should be possible to handle uniforms during this pass,
    * but, this will require changes to the other uniform block
    * support code.
    */
   if (var->data.mode == ir_var_uniform || var->data.mode == ir_var_shader_storage)
      return;

   if (var->get_interface_type() != NULL) {
      char *iface_field_name =
         ralloc_asprintf(mem_ctx, "%s %s.%s.%s",
                         var->data.mode == ir_var_shader_in ? "in" : "out",
                         var->get_interface_type()->name,
                         var->name,
                         ir->record->type->fields.structure[ir->field_idx].name);

      /* Find the variable in the set of flattened interface blocks */
      hash_entry *entry = _mesa_hash_table_search(interface_namespace,
                                                  iface_field_name);
      assert(entry);
      ir_variable *found_var = (ir_variable *) entry->data;

      ir_dereference_variable *deref_var =
         new(mem_ctx) ir_dereference_variable(found_var);

      ir_dereference_array *deref_array =
         ir->record->as_dereference_array();
      if (deref_array != NULL) {
         *rvalue = process_array_ir(mem_ctx, deref_array,
                                    (ir_rvalue *)deref_var);
      } else {
         *rvalue = deref_var;
      }
   }
}